

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xr_generated_api_dump.cpp
# Opt level: O3

bool ApiDumpOutputXrStruct
               (XrGeneratedDispatchTable *gen_dispatch_table,
               XrSpatialAnchorsCreateInfoFromUuidsML *value,string *prefix,string *type_string,
               bool is_pointer,
               vector<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *contents)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  byte bVar2;
  XrStructureType XVar3;
  pointer pcVar4;
  PFN_xrStructureTypeToString p_Var5;
  void *value_00;
  XrUuidEXT *pXVar6;
  XrStructureType __val;
  uint uVar7;
  char cVar8;
  bool bVar9;
  char cVar10;
  char *pcVar11;
  XrInstance pXVar12;
  invalid_argument *piVar13;
  uint uVar14;
  long lVar15;
  ulong uVar16;
  ulong uVar17;
  XrGeneratedDispatchTable *gen_dispatch_table_00;
  uint uVar18;
  string uuids_prefix;
  string next_prefix;
  string uuidcount_prefix;
  string storage_prefix;
  string uuids_array_prefix;
  string type_prefix;
  string __str_1;
  ostringstream oss_storage;
  ostringstream oss_uuidCount;
  ostringstream oss_uuids_array;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5e0;
  long *local_5c0;
  long local_5b8;
  long local_5b0 [2];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_5a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_580;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_560;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_540;
  long *local_520;
  uint local_518;
  long local_510 [2];
  undefined1 local_500 [16];
  PFN_xrEnumerateInstanceExtensionProperties local_4f0;
  string local_4e0;
  XrGeneratedDispatchTable *local_4c0;
  string local_4b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_498;
  PFN_xrCreateActionSpace local_478;
  PFN_xrLocateSpace p_Stack_470;
  PFN_xrDestroySpace local_468;
  PFN_xrEnumerateViewConfigurations p_Stack_460;
  ios_base local_428 [264];
  undefined1 local_320 [24];
  XrSpatialAnchorsStorageML_T aXStack_308 [88];
  ios_base local_2b0 [264];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [3];
  ios_base local_138 [264];
  
  paVar1 = &local_498.field_2;
  local_498._M_dataplus._M_p = (pointer)paVar1;
  local_320._0_8_ = value;
  std::__cxx11::string::_M_construct((ulong)&local_498,'\x12');
  *local_498._M_dataplus._M_p = '0';
  local_498._M_dataplus._M_p[1] = 'x';
  pcVar11 = local_498._M_dataplus._M_p + local_498._M_string_length + -1;
  lVar15 = 0;
  do {
    bVar2 = local_320[lVar15];
    *pcVar11 = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 & 0xf];
    pcVar11[-1] = to_hex[abi:cxx11](unsigned_char_const*,unsigned_long)::hex[bVar2 >> 4];
    lVar15 = lVar15 + 1;
    pcVar11 = pcVar11 + -2;
  } while (lVar15 != 8);
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<std::__cxx11::string&,std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,type_string,prefix,&local_498);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_498._M_dataplus._M_p != paVar1) {
    operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::string::append((char *)prefix);
  local_540._M_dataplus._M_p = (pointer)&local_540.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_540,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_540);
  if (gen_dispatch_table == (XrGeneratedDispatchTable *)0x0) {
    XVar3 = value->type;
    __val = -XVar3;
    if (0 < (int)XVar3) {
      __val = XVar3;
    }
    uVar18 = 1;
    if (XR_TYPE_SWAPCHAIN_CREATE_INFO < __val) {
      uVar17 = (ulong)__val;
      uVar7 = 4;
      do {
        uVar18 = uVar7;
        uVar14 = (uint)uVar17;
        if (uVar14 < 100) {
          uVar18 = uVar18 - 2;
          goto LAB_001adc88;
        }
        if (uVar14 < 1000) {
          uVar18 = uVar18 - 1;
          goto LAB_001adc88;
        }
        if (uVar14 < 10000) goto LAB_001adc88;
        uVar17 = uVar17 / 10000;
        uVar7 = uVar18 + 4;
      } while (99999 < uVar14);
      uVar18 = uVar18 + 1;
    }
LAB_001adc88:
    local_4c0 = gen_dispatch_table;
    local_498._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct((ulong)&local_498,(char)uVar18 - (char)((int)XVar3 >> 0x1f));
    std::__detail::__to_chars_10_impl<unsigned_int>
              (local_498._M_dataplus._M_p + (XVar3 >> 0x1f),uVar18,__val);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,std::__cxx11::string>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_540,&local_498);
    gen_dispatch_table = local_4c0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_498._M_dataplus._M_p != paVar1) {
      operator_delete(local_498._M_dataplus._M_p,local_498.field_2._M_allocated_capacity + 1);
    }
  }
  else {
    local_468 = (PFN_xrDestroySpace)0x0;
    p_Stack_460 = (PFN_xrEnumerateViewConfigurations)0x0;
    local_478 = (PFN_xrCreateActionSpace)0x0;
    p_Stack_470 = (PFN_xrLocateSpace)0x0;
    local_498.field_2._M_allocated_capacity = 0;
    local_498.field_2._8_8_ = 0;
    local_498._M_dataplus._M_p = (pointer)0x0;
    local_498._M_string_length = 0;
    p_Var5 = gen_dispatch_table->StructureTypeToString;
    pXVar12 = FindInstanceFromDispatchTable(gen_dispatch_table);
    (*p_Var5)(pXVar12,value->type,(char *)&local_498);
    std::
    vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
    ::emplace_back<char_const(&)[16],std::__cxx11::string&,char(&)[64]>
              ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
                *)contents,(char (*) [16])"XrStructureType",&local_540,(char (*) [64])&local_498);
  }
  local_5c0 = local_5b0;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5c0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_5c0);
  value_00 = value->next;
  local_4b8._M_dataplus._M_p = (pointer)&local_4b8.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_4b8,local_5c0,local_5b8 + (long)local_5c0);
  bVar9 = ApiDumpDecodeNextChain(gen_dispatch_table,value_00,&local_4b8,contents);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4b8._M_dataplus._M_p != &local_4b8.field_2) {
    operator_delete(local_4b8._M_dataplus._M_p,local_4b8.field_2._M_allocated_capacity + 1);
  }
  if (!bVar9) {
    piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
    std::invalid_argument::invalid_argument(piVar13,"Invalid Operation");
    __cxa_throw(piVar13,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
  }
  local_580._M_dataplus._M_p = (pointer)&local_580.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_580,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_580);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&local_498);
  *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_498.field_2 + *(long *)(local_498._M_dataplus._M_p + -0x18) + 8) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(&local_498);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[26],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [26])"XrSpatialAnchorsStorageML",&local_580,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_320);
  if ((XrSpatialAnchorsCreateInfoFromUuidsML *)local_320._0_8_ !=
      (XrSpatialAnchorsCreateInfoFromUuidsML *)(local_320 + 0x10)) {
    operator_delete((void *)local_320._0_8_,local_320._16_8_ + 1);
  }
  local_5a0._M_dataplus._M_p = (pointer)&local_5a0.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5a0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_5a0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_320);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_320,"0x",2);
  *(uint *)(aXStack_308 + (long)*(XrSpatialAnchorsStorageML *)(local_320._0_8_ + -0x18)) =
       *(uint *)(aXStack_308 + (long)*(XrSpatialAnchorsStorageML *)(local_320._0_8_ + -0x18)) &
       0xffffffb5 | 8;
  std::ostream::_M_insert<unsigned_long>((ulong)local_320);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[9],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [9])"uint32_t",&local_5a0,local_1a8);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1a8[0]._M_dataplus._M_p != &local_1a8[0].field_2) {
    operator_delete(local_1a8[0]._M_dataplus._M_p,local_1a8[0].field_2._M_allocated_capacity + 1);
  }
  local_5e0._M_dataplus._M_p = (pointer)&local_5e0.field_2;
  pcVar4 = (prefix->_M_dataplus)._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_5e0,pcVar4,pcVar4 + prefix->_M_string_length);
  std::__cxx11::string::append((char *)&local_5e0);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
       *(uint *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8)
       & 0xffffffb5 | 8;
  std::ostream::_M_insert<void_const*>(local_1a8);
  std::__cxx11::stringbuf::str();
  std::
  vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
  ::emplace_back<char_const(&)[17],std::__cxx11::string&,std::__cxx11::string>
            ((vector<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>,std::allocator<std::tuple<std::__cxx11::string,std::__cxx11::string,std::__cxx11::string>>>
              *)contents,(char (*) [17])"const XrUuidEXT*",&local_5e0,&local_560);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_560._M_dataplus._M_p != &local_560.field_2) {
    operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
  }
  if (value->uuidCount != 0) {
    uVar17 = 0;
    do {
      local_560._M_dataplus._M_p = (pointer)&local_560.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_560,local_5e0._M_dataplus._M_p,
                 local_5e0._M_dataplus._M_p + local_5e0._M_string_length);
      std::__cxx11::string::append((char *)&local_560);
      cVar10 = '\x01';
      if (9 < uVar17) {
        uVar16 = uVar17;
        cVar8 = '\x04';
        do {
          cVar10 = cVar8;
          uVar18 = (uint)uVar16;
          if (uVar18 < 100) {
            cVar10 = cVar10 + -2;
            goto LAB_001ae0a3;
          }
          if (uVar18 < 1000) {
            cVar10 = cVar10 + -1;
            goto LAB_001ae0a3;
          }
          if (uVar18 < 10000) goto LAB_001ae0a3;
          uVar16 = (uVar16 & 0xffffffff) / 10000;
          cVar8 = cVar10 + '\x04';
        } while (99999 < uVar18);
        cVar10 = cVar10 + '\x01';
      }
LAB_001ae0a3:
      local_520 = local_510;
      std::__cxx11::string::_M_construct((ulong)&local_520,cVar10);
      std::__detail::__to_chars_10_impl<unsigned_int>((char *)local_520,local_518,(uint)uVar17);
      std::__cxx11::string::_M_append((char *)&local_560,(ulong)local_520);
      if (local_520 != local_510) {
        operator_delete(local_520,local_510[0] + 1);
      }
      std::__cxx11::string::append((char *)&local_560);
      pXVar6 = value->uuids;
      local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)(local_500 + 0x20),local_560._M_dataplus._M_p,
                 local_560._M_dataplus._M_p + local_560._M_string_length);
      local_500._0_8_ = local_500 + 0x10;
      gen_dispatch_table_00 = (XrGeneratedDispatchTable *)local_500;
      std::__cxx11::string::_M_construct<char_const*>((string *)local_500,"const XrUuidEXT*","");
      bVar9 = ApiDumpOutputXrStruct
                        (gen_dispatch_table_00,pXVar6 + uVar17,(string *)(local_500 + 0x20),
                         (string *)local_500,false,contents);
      if ((undefined1 *)local_500._0_8_ != local_500 + 0x10) {
        operator_delete((void *)local_500._0_8_,(ulong)(local_4f0 + 1));
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
        operator_delete(local_4e0._M_dataplus._M_p,
                        (ulong)(local_4e0.field_2._M_allocated_capacity + 1));
      }
      if (!bVar9) {
        piVar13 = (invalid_argument *)__cxa_allocate_exception(0x10);
        std::invalid_argument::invalid_argument(piVar13,"Invalid Operation");
        __cxa_throw(piVar13,&std::invalid_argument::typeinfo,
                    std::invalid_argument::~invalid_argument);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_560._M_dataplus._M_p != &local_560.field_2) {
        operator_delete(local_560._M_dataplus._M_p,local_560.field_2._M_allocated_capacity + 1);
      }
      uVar17 = uVar17 + 1;
    } while (uVar17 < value->uuidCount);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5e0._M_dataplus._M_p != &local_5e0.field_2) {
    operator_delete(local_5e0._M_dataplus._M_p,local_5e0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_320);
  std::ios_base::~ios_base(local_2b0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_5a0._M_dataplus._M_p != &local_5a0.field_2) {
    operator_delete(local_5a0._M_dataplus._M_p,local_5a0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)&local_498);
  std::ios_base::~ios_base(local_428);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_580._M_dataplus._M_p != &local_580.field_2) {
    operator_delete(local_580._M_dataplus._M_p,local_580.field_2._M_allocated_capacity + 1);
  }
  if (local_5c0 != local_5b0) {
    operator_delete(local_5c0,local_5b0[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_540._M_dataplus._M_p != &local_540.field_2) {
    operator_delete(local_540._M_dataplus._M_p,local_540.field_2._M_allocated_capacity + 1);
  }
  return true;
}

Assistant:

bool ApiDumpOutputXrStruct(XrGeneratedDispatchTable* gen_dispatch_table, const XrSpatialAnchorsCreateInfoFromUuidsML* value,
                           std::string prefix, std::string type_string, bool is_pointer,
                           std::vector<std::tuple<std::string, std::string, std::string>> &contents) {
    (void)gen_dispatch_table;  // silence warning
    try {
        contents.emplace_back(type_string, prefix, PointerToHexString(value));
        if (is_pointer) {
            prefix += "->";
        } else {
            prefix += ".";
        }
        std::string type_prefix = prefix;
        type_prefix += "type";
        if (nullptr != gen_dispatch_table) {
            char type_string[XR_MAX_STRUCTURE_NAME_SIZE] = {};
            gen_dispatch_table->StructureTypeToString(FindInstanceFromDispatchTable(gen_dispatch_table),
                                                      value->type, type_string);
            contents.emplace_back("XrStructureType", type_prefix, type_string);
        } else {
                        contents.emplace_back("XrStructureType", type_prefix, std::to_string(value->type));
        }
        std::string next_prefix = prefix;
        next_prefix += "next";
        // Decode the next chain if it exists
        if (!ApiDumpDecodeNextChain(gen_dispatch_table, value->next, next_prefix, contents)) {
            throw std::invalid_argument("Invalid Operation");
        }
        std::string storage_prefix = prefix;
        storage_prefix += "storage";
        std::ostringstream oss_storage;
        oss_storage << std::hex << reinterpret_cast<const void*>(value->storage);
        contents.emplace_back("XrSpatialAnchorsStorageML", storage_prefix, oss_storage.str());
        std::string uuidcount_prefix = prefix;
        uuidcount_prefix += "uuidCount";
        std::ostringstream oss_uuidCount;
        oss_uuidCount << "0x" << std::hex << (value->uuidCount);
        contents.emplace_back("uint32_t", uuidcount_prefix, oss_uuidCount.str());
        std::string uuids_prefix = prefix;
        uuids_prefix += "uuids";
        std::ostringstream oss_uuids_array;
        oss_uuids_array << std::hex << reinterpret_cast<const void*>(value->uuids);
        contents.emplace_back("const XrUuidEXT*", uuids_prefix, oss_uuids_array.str());
        for (uint32_t value_uuids_inc = 0; value_uuids_inc < value->uuidCount; ++value_uuids_inc) {
            std::string uuids_array_prefix = uuids_prefix;
            uuids_array_prefix += "[";
            uuids_array_prefix += std::to_string(value_uuids_inc);
            uuids_array_prefix += "]";
            if (!ApiDumpOutputXrStruct(gen_dispatch_table, &value->uuids[value_uuids_inc], uuids_array_prefix, "const XrUuidEXT*", false, contents)) {
                throw std::invalid_argument("Invalid Operation");
            }
        }
        return true;
    } catch(...) {
    }
    return false;
}